

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_namedict.c
# Opt level: O0

HPDF_STATUS HPDF_EmbeddedFile_SetName(HPDF_EmbeddedFile emfile,char *new_name)

{
  HPDF_Dict p_Var1;
  HPDF_String obj;
  HPDF_String obj_00;
  HPDF_EmbeddedFile local_40;
  HPDF_STATUS status;
  HPDF_String ufname;
  HPDF_String name;
  HPDF_Dict filestream;
  char *new_name_local;
  HPDF_EmbeddedFile emfile_local;
  
  p_Var1 = HPDF_EmbeddedFile_GetFileStream(emfile);
  if (p_Var1 == (HPDF_Dict)0x0) {
    emfile_local = (HPDF_EmbeddedFile)0x1033;
  }
  else {
    obj = HPDF_String_New(emfile->mmgr,new_name,(HPDF_Encoder_conflict)0x0);
    if (obj == (HPDF_String)0x0) {
      emfile_local = (HPDF_EmbeddedFile)0x1015;
    }
    else {
      obj_00 = HPDF_String_New(emfile->mmgr,new_name,(HPDF_Encoder_conflict)0x0);
      if (obj_00 == (HPDF_String)0x0) {
        emfile_local = (HPDF_EmbeddedFile)0x1015;
      }
      else {
        local_40 = (HPDF_EmbeddedFile)HPDF_Dict_Add(emfile,"F",obj);
        if (local_40 == (HPDF_EmbeddedFile)0x0) {
          local_40 = (HPDF_EmbeddedFile)HPDF_Dict_Add(emfile,"UF",obj_00);
        }
        emfile_local = local_40;
      }
    }
  }
  return (HPDF_STATUS)emfile_local;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_EmbeddedFile_SetName  (HPDF_EmbeddedFile  emfile,
                            const char        *new_name)
{
    HPDF_Dict filestream;
    HPDF_String name;           /* the name of the file: /F (name) */
    HPDF_String ufname;         /* the unicode name of the file: /UF (name) */
    HPDF_STATUS status;

    filestream = HPDF_EmbeddedFile_GetFileStream(emfile);
    if (!filestream)
        return HPDF_INVALID_OBJECT;

    name = HPDF_String_New (emfile->mmgr, new_name, NULL);
    if (!name)
        return HPDF_FAILED_TO_ALLOC_MEM;

    ufname = HPDF_String_New (emfile->mmgr, new_name, NULL);
    if (!ufname)
        return HPDF_FAILED_TO_ALLOC_MEM;

    status = HPDF_Dict_Add (emfile, "F", name);
    if (status == HPDF_OK)
        status = HPDF_Dict_Add (emfile, "UF", ufname);

    return status;
}